

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_trie.hpp
# Opt level: O3

node_map * __thiscall
poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::expand
          (node_map *__return_storage_ptr__,plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *this
          )

{
  uint64_t uVar1;
  pointer puVar2;
  byte bVar3;
  pointer puVar4;
  node_map *pnVar5;
  pointer puVar6;
  ulong uVar7;
  uint64_t uVar8;
  pointer ppVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  pair<unsigned_long,_unsigned_long> pVar13;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  path;
  bit_vector done_flags;
  uint64_t new_node_id;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_138;
  undefined1 local_118 [16];
  pointer puStack_108;
  uint64_t local_100;
  uint64_t *local_f8;
  node_map *local_f0;
  pair<unsigned_long,_unsigned_long> local_e8;
  size_p2 sStack_d8;
  size_p2 sStack_c8;
  uint64_t local_b8;
  uint64_t uStack_b0;
  uint64_t local_a8;
  undefined1 local_98 [16];
  pointer local_88;
  uint64_t local_80;
  uint64_t uStack_78;
  uint64_t local_70;
  uint64_t local_68;
  uint64_t uStack_60;
  size_p2 sStack_58;
  size_p2 sStack_48;
  
  plain_bonsai_trie((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)local_98,
                    (this->capa_size_).bits_ + 1,(this->symb_size_).bits_);
  local_68 = 1;
  bit_vector::bit_vector((bit_vector *)local_118,(this->capa_size_).mask_ + 1);
  *(ulong *)local_118._0_8_ = *(ulong *)local_118._0_8_ | 2;
  compact_vector::set(&this->table_,1,1);
  local_138.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_138.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_138.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pair<unsigned_long,_unsigned_long> *)0x0;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::reserve(&local_138,0x100);
  local_f8 = &(this->table_).size_;
  uVar8 = (this->table_).size_;
  puVar6 = (pointer)local_118._0_8_;
  local_f0 = __return_storage_ptr__;
  if (2 < uVar8) {
    uVar12 = 2;
    do {
      if ((puVar6[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0) {
        uVar1 = (this->table_).width_;
        puVar2 = (this->table_).chunks_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = uVar1 * uVar12;
        uVar11 = (ulong)((uint)uVar7 & 0x3f);
        uVar10 = puVar2[uVar7 >> 6];
        if (uVar1 + uVar11 < 0x41) {
          uVar10 = uVar10 >> uVar11;
        }
        else {
          bVar3 = (byte)uVar7 & 0x3f;
          uVar10 = uVar10 >> bVar3 | puVar2[(uVar7 >> 6) + 1] << 0x40 - bVar3;
        }
        if (((this->table_).mask_ & uVar10) != 0) {
          uVar10 = uVar12;
          if (local_138.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_138.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_138.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_138.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          do {
            pVar13 = get_parent_and_symb(this,uVar10);
            local_e8.second = pVar13.second;
            uVar7 = pVar13.first;
            local_e8.first = uVar10;
            if (local_138.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_138.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                        ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                          *)&local_138,
                         (iterator)
                         local_138.
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_e8);
            }
            else {
              (local_138.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = uVar10;
              (local_138.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = local_e8.second;
              local_138.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_138.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar10 = uVar7;
          } while ((*(ulong *)(local_118._0_8_ + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f) & 1) == 0);
          uVar8 = (this->table_).width_;
          puVar6 = (this->table_).chunks_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = uVar7 * uVar8;
          uVar11 = (ulong)((uint)uVar7 & 0x3f);
          uVar10 = puVar6[uVar7 >> 6];
          if (uVar8 + uVar11 < 0x41) {
            uVar10 = uVar10 >> uVar11;
          }
          else {
            bVar3 = (byte)uVar7 & 0x3f;
            uVar10 = uVar10 >> bVar3 | puVar6[(uVar7 >> 6) + 1] << 0x40 - bVar3;
          }
          local_e8.first = uVar10 & (this->table_).mask_;
          ppVar9 = local_138.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          while (ppVar9 != local_138.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) {
            add_child((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)local_98,&local_e8.first
                      ,ppVar9[-1].second);
            ppVar9 = ppVar9 + -1;
            compact_vector::set(&this->table_,ppVar9->first,local_e8.first);
            *(ulong *)(local_118._0_8_ + (ppVar9->first >> 6) * 8) =
                 *(ulong *)(local_118._0_8_ + (ppVar9->first >> 6) * 8) |
                 1L << (ppVar9->first & 0x3f);
          }
          uVar8 = *local_f8;
          puVar6 = (pointer)local_118._0_8_;
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar8);
  }
  pnVar5 = local_f0;
  puVar4 = puStack_108;
  puVar2 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (local_f0->map_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start =
       (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (local_f0->map_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = puVar2;
  (local_f0->map_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  uVar8 = local_f8[1];
  (local_f0->map_).size_ = *local_f8;
  (local_f0->map_).mask_ = uVar8;
  (local_f0->map_).width_ = local_f8[2];
  (local_f0->done_flags_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = puVar6;
  puStack_108 = (pointer)0x0;
  (local_f0->done_flags_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_118._8_8_;
  (local_f0->done_flags_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar4;
  local_118 = ZEXT816(0) << 0x20;
  (local_f0->done_flags_).size_ = local_100;
  local_a8 = local_f8[2];
  local_b8 = *local_f8;
  uStack_b0 = local_f8[1];
  local_e8.first = this->size_;
  local_e8.second = this->max_size_;
  sStack_d8.bits_ = (this->capa_size_).bits_;
  sStack_d8._4_4_ = *(undefined4 *)&(this->capa_size_).field_0x4;
  sStack_d8.mask_ = (this->capa_size_).mask_;
  sStack_c8.bits_ = (this->symb_size_).bits_;
  sStack_c8._4_4_ = *(undefined4 *)&(this->symb_size_).field_0x4;
  sStack_c8.mask_ = (this->symb_size_).mask_;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_98._0_8_;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_98._8_8_;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_88;
  local_f8[2] = local_70;
  *local_f8 = local_80;
  local_f8[1] = uStack_78;
  (this->capa_size_).bits_ = sStack_58.bits_;
  *(undefined4 *)&(this->capa_size_).field_0x4 = sStack_58._4_4_;
  (this->capa_size_).mask_ = sStack_58.mask_;
  (this->symb_size_).bits_ = sStack_48.bits_;
  *(undefined4 *)&(this->symb_size_).field_0x4 = sStack_48._4_4_;
  (this->symb_size_).mask_ = sStack_48.mask_;
  this->size_ = local_68;
  this->max_size_ = uStack_60;
  (this->capa_size_).bits_ = sStack_58.bits_;
  *(undefined4 *)&(this->capa_size_).field_0x4 = sStack_58._4_4_;
  (this->capa_size_).mask_ = sStack_58.mask_;
  local_88 = (pointer)0x0;
  local_98 = local_118;
  local_80 = local_b8;
  uStack_78 = uStack_b0;
  local_70 = local_a8;
  local_68 = local_e8.first;
  uStack_60 = local_e8.second;
  sStack_58._0_8_ = sStack_d8._0_8_;
  sStack_58.mask_ = sStack_d8.mask_;
  sStack_48._0_8_ = sStack_c8._0_8_;
  sStack_48.mask_ = sStack_c8.mask_;
  if (local_138.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_138.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    if ((pointer)local_118._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_118._0_8_,(long)puStack_108 - local_118._0_8_);
    }
  }
  if ((pointer)local_98._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
  }
  return pnVar5;
}

Assistant:

node_map expand() {
        plain_bonsai_trie new_ht{capa_bits() + 1, symb_size_.bits()};
        new_ht.add_root();

#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        bit_vector done_flags(capa_size());
        done_flags.set(get_root());

        table_.set(get_root(), new_ht.get_root());

        std::vector<std::pair<uint64_t, uint64_t>> path;
        path.reserve(256);

        // 0 is empty, 1 is root
        for (uint64_t i = 2; i < table_.size(); ++i) {
            if (done_flags[i] || table_[i] == 0) {
                // skip already processed or empty elements
                continue;
            }

            path.clear();
            uint64_t node_id = i;

            do {
                auto [parent, label] = get_parent_and_symb(node_id);
                assert(parent != nil_id);
                path.emplace_back(std::make_pair(node_id, label));
                node_id = parent;
            } while (!done_flags[node_id]);

            uint64_t new_node_id = table_[node_id];

            for (auto rit = std::rbegin(path); rit != std::rend(path); ++rit) {
                new_ht.add_child(new_node_id, rit->second);
                table_.set(rit->first, new_node_id);
                done_flags.set(rit->first);
            }
        }

        node_map node_map{std::move(table_), std::move(done_flags)};
        std::swap(*this, new_ht);

        return node_map;
    }